

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManInvertConstraints(Aig_Man_t *pAig)

{
  void *pvVar1;
  int iVar2;
  int i;
  
  if (pAig->nConstrs != 0) {
    iVar2 = pAig->nTruePos;
    for (i = 0; i < iVar2; i = i + 1) {
      pvVar1 = Vec_PtrEntry(pAig->vCos,i);
      iVar2 = pAig->nTruePos;
      if (iVar2 - pAig->nConstrs <= i) {
        if (((ulong)pvVar1 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
        }
        *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) ^ 1;
      }
    }
  }
  return;
}

Assistant:

void Aig_ManInvertConstraints( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    if ( Aig_ManConstrNum(pAig) == 0 )
        return;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i >= Saig_ManPoNum(pAig) - Aig_ManConstrNum(pAig) )
            Aig_ObjChild0Flip( pObj );
    }
}